

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

VarConcat * __thiscall kratos::VarConcat::concat(VarConcat *this,Var *var)

{
  undefined1 local_48 [8];
  shared_ptr<kratos::VarConcat> result;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  Var::as<kratos::VarConcat>
            ((Var *)&result.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            (local_28,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                      &var->super_enable_shared_from_this<kratos::Var>);
  std::
  make_shared<kratos::VarConcat,std::shared_ptr<kratos::VarConcat>,std::shared_ptr<kratos::Var>>
            ((shared_ptr<kratos::VarConcat> *)local_48,
             (shared_ptr<kratos::Var> *)
             &result.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
  ::emplace_back<std::shared_ptr<kratos::VarConcat>const&>
            ((vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
              *)&(*(this->vars_).super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>.
                   _M_impl.super__Vector_impl_data._M_start)->concat_vars_,
             (shared_ptr<kratos::VarConcat> *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&result);
  return (VarConcat *)local_48;
}

Assistant:

VarConcat &VarConcat::concat(kratos::Var &var) {
    auto result = std::make_shared<VarConcat>(as<VarConcat>(), var.shared_from_this());
    // add it to the first one
    vars_[0]->add_concat_var(result);
    return *result;
}